

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenReturn(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  Return *pRVar1;
  Builder local_28 [2];
  Return *ret;
  BinaryenExpressionRef value_local;
  BinaryenModuleRef module_local;
  
  ret = (Return *)value;
  value_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(local_28,module);
  pRVar1 = wasm::Builder::makeReturn(local_28,(Expression *)ret);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenReturn(BinaryenModuleRef module,
                                     BinaryenExpressionRef value) {
  auto* ret = Builder(*(Module*)module).makeReturn((Expression*)value);
  return static_cast<Expression*>(ret);
}